

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# single_particleSpectra.cpp
# Opt level: O2

void __thiscall
singleParticleSpectra::calculate_three_particle_correlation_deltaeta_chdep
          (singleParticleSpectra *this,
          vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
          *event_Qn_p_rap_real,
          vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
          *event_Qn_p_rap_imag,
          vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
          *event_Qn_m_rap_real,
          vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
          *event_Qn_m_rap_imag,
          vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
          *event_Qn_rap_real,
          vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
          *event_Qn_rap_imag,
          vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
          *Cmnk_ss_eta12,
          vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
          *Cmnk_ss_eta12_err,
          vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
          *Cmnk_os_eta12,
          vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
          *Cmnk_os_eta12_err,
          vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
          *Cmnk_ss_eta13,
          vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
          *Cmnk_ss_eta13_err,
          vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
          *Cmnk_os_eta13,
          vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
          *Cmnk_os_eta13_err)

{
  int iVar1;
  pointer pvVar2;
  pointer pvVar3;
  pointer pvVar4;
  pointer pvVar5;
  pointer pvVar6;
  pointer pvVar7;
  pointer pvVar8;
  long lVar9;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  long lVar13;
  double dVar14;
  allocator_type local_15a;
  allocator_type local_159;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  temp_Cmnk_err;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  temp_Cmnk_os_4;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  temp_Cmnk_os_3;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  temp_Cmnk_os_2;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  temp_Cmnk_os_1;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  temp_Cmnk_ss_4;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  temp_Cmnk_ss_3;
  value_type_conflict local_98;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  temp_Cmnk_ss_2;
  _Vector_base<double,_std::allocator<double>_> local_78;
  ulong local_60;
  ulong local_58;
  pointer local_50;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  temp_Cmnk_ss_1;
  
  iVar1 = this->num_corr;
  temp_Cmnk_ss_3.
  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)&temp_Cmnk_ss_2,(long)this->N_rap,
             (value_type_conflict *)&temp_Cmnk_ss_3,(allocator_type *)&temp_Cmnk_ss_4);
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::vector(&temp_Cmnk_ss_1,(long)iVar1,(value_type *)&temp_Cmnk_ss_2,
           (allocator_type *)&temp_Cmnk_os_1);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            ((_Vector_base<double,_std::allocator<double>_> *)&temp_Cmnk_ss_2);
  iVar1 = this->num_corr;
  temp_Cmnk_ss_4.
  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)&temp_Cmnk_ss_3,(long)this->N_rap,
             (value_type_conflict *)&temp_Cmnk_ss_4,(allocator_type *)&temp_Cmnk_os_1);
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::vector(&temp_Cmnk_ss_2,(long)iVar1,(value_type *)&temp_Cmnk_ss_3,
           (allocator_type *)&temp_Cmnk_os_2);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            ((_Vector_base<double,_std::allocator<double>_> *)&temp_Cmnk_ss_3);
  iVar1 = this->num_corr;
  temp_Cmnk_os_1.
  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)&temp_Cmnk_ss_4,(long)this->N_rap,
             (value_type_conflict *)&temp_Cmnk_os_1,(allocator_type *)&temp_Cmnk_os_2);
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::vector(&temp_Cmnk_ss_3,(long)iVar1,(value_type *)&temp_Cmnk_ss_4,
           (allocator_type *)&temp_Cmnk_os_3);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            ((_Vector_base<double,_std::allocator<double>_> *)&temp_Cmnk_ss_4);
  iVar1 = this->num_corr;
  temp_Cmnk_os_2.
  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)&temp_Cmnk_os_1,(long)this->N_rap,
             (value_type_conflict *)&temp_Cmnk_os_2,(allocator_type *)&temp_Cmnk_os_3);
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::vector(&temp_Cmnk_ss_4,(long)iVar1,(value_type *)&temp_Cmnk_os_1,
           (allocator_type *)&temp_Cmnk_os_4);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            ((_Vector_base<double,_std::allocator<double>_> *)&temp_Cmnk_os_1);
  iVar1 = this->num_corr;
  temp_Cmnk_os_3.
  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)&temp_Cmnk_os_2,(long)this->N_rap,
             (value_type_conflict *)&temp_Cmnk_os_3,(allocator_type *)&temp_Cmnk_os_4);
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::vector(&temp_Cmnk_os_1,(long)iVar1,(value_type *)&temp_Cmnk_os_2,
           (allocator_type *)&temp_Cmnk_err);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            ((_Vector_base<double,_std::allocator<double>_> *)&temp_Cmnk_os_2);
  iVar1 = this->num_corr;
  temp_Cmnk_os_4.
  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)&temp_Cmnk_os_3,(long)this->N_rap,
             (value_type_conflict *)&temp_Cmnk_os_4,(allocator_type *)&temp_Cmnk_err);
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::vector(&temp_Cmnk_os_2,(long)iVar1,(value_type *)&temp_Cmnk_os_3,(allocator_type *)&local_78);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            ((_Vector_base<double,_std::allocator<double>_> *)&temp_Cmnk_os_3);
  iVar1 = this->num_corr;
  temp_Cmnk_err.
  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)&temp_Cmnk_os_4,(long)this->N_rap,
             (value_type_conflict *)&temp_Cmnk_err,(allocator_type *)&local_78);
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::vector(&temp_Cmnk_os_3,(long)iVar1,(value_type *)&temp_Cmnk_os_4,(allocator_type *)&local_98);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            ((_Vector_base<double,_std::allocator<double>_> *)&temp_Cmnk_os_4);
  iVar1 = this->num_corr;
  local_78._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)&temp_Cmnk_err,(long)this->N_rap,
             (value_type_conflict *)&local_78,(allocator_type *)&local_98);
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::vector(&temp_Cmnk_os_4,(long)iVar1,(value_type *)&temp_Cmnk_err,&local_15a);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            ((_Vector_base<double,_std::allocator<double>_> *)&temp_Cmnk_err);
  iVar1 = this->num_corr;
  local_98 = 0.0;
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)&local_78,(long)this->N_rap,&local_98,
             (allocator_type *)&local_15a);
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::vector(&temp_Cmnk_err,(long)iVar1,(value_type *)&local_78,&local_159);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base(&local_78);
  calculate_three_particle_correlation_deltaeta
            (this,event_Qn_p_rap_real,event_Qn_p_rap_imag,event_Qn_m_rap_real,event_Qn_m_rap_imag,
             event_Qn_rap_real,event_Qn_rap_imag,1,2,&temp_Cmnk_os_1,&temp_Cmnk_err);
  calculate_three_particle_correlation_deltaeta
            (this,event_Qn_m_rap_real,event_Qn_m_rap_imag,event_Qn_p_rap_real,event_Qn_p_rap_imag,
             event_Qn_rap_real,event_Qn_rap_imag,1,2,&temp_Cmnk_os_2,&temp_Cmnk_err);
  calculate_three_particle_correlation_deltaeta
            (this,event_Qn_p_rap_real,event_Qn_p_rap_imag,event_Qn_m_rap_real,event_Qn_m_rap_imag,
             event_Qn_rap_real,event_Qn_rap_imag,2,2,&temp_Cmnk_os_3,&temp_Cmnk_err);
  calculate_three_particle_correlation_deltaeta
            (this,event_Qn_m_rap_real,event_Qn_m_rap_imag,event_Qn_p_rap_real,event_Qn_p_rap_imag,
             event_Qn_rap_real,event_Qn_rap_imag,2,2,&temp_Cmnk_os_4,&temp_Cmnk_err);
  calculate_three_particle_correlation_deltaeta
            (this,event_Qn_p_rap_real,event_Qn_p_rap_imag,event_Qn_p_rap_real,event_Qn_p_rap_imag,
             event_Qn_rap_real,event_Qn_rap_imag,1,1,&temp_Cmnk_ss_1,&temp_Cmnk_err);
  calculate_three_particle_correlation_deltaeta
            (this,event_Qn_m_rap_real,event_Qn_m_rap_imag,event_Qn_m_rap_real,event_Qn_m_rap_imag,
             event_Qn_rap_real,event_Qn_rap_imag,1,1,&temp_Cmnk_ss_2,&temp_Cmnk_err);
  calculate_three_particle_correlation_deltaeta
            (this,event_Qn_p_rap_real,event_Qn_p_rap_imag,event_Qn_p_rap_real,event_Qn_p_rap_imag,
             event_Qn_rap_real,event_Qn_rap_imag,2,1,&temp_Cmnk_ss_3,&temp_Cmnk_err);
  calculate_three_particle_correlation_deltaeta
            (this,event_Qn_m_rap_real,event_Qn_m_rap_imag,event_Qn_m_rap_real,event_Qn_m_rap_imag,
             event_Qn_rap_real,event_Qn_rap_imag,2,1,&temp_Cmnk_ss_4,&temp_Cmnk_err);
  uVar11 = 0;
  uVar10 = (ulong)(uint)this->N_rap;
  if (this->N_rap < 1) {
    uVar10 = uVar11;
  }
  local_60 = (ulong)(uint)this->num_corr;
  if (this->num_corr < 1) {
    local_60 = uVar11;
  }
  while (uVar12 = uVar11, uVar12 != local_60) {
    local_50 = (Cmnk_ss_eta12->
               super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start + uVar12;
    pvVar2 = (Cmnk_ss_eta12_err->
             super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    pvVar3 = (Cmnk_ss_eta13->
             super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    pvVar4 = (Cmnk_ss_eta13_err->
             super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    pvVar5 = (Cmnk_os_eta12->
             super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    pvVar6 = (Cmnk_os_eta12_err->
             super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    pvVar7 = (Cmnk_os_eta13->
             super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    pvVar8 = (Cmnk_os_eta13_err->
             super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    for (lVar13 = 0; uVar10 << 3 != lVar13; lVar13 = lVar13 + 8) {
      dVar14 = *(double *)
                ((long)temp_Cmnk_ss_1.
                       super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start[uVar12].
                       super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_start + lVar13) +
               *(double *)
                ((long)temp_Cmnk_ss_2.
                       super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start[uVar12].
                       super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_start + lVar13);
      lVar9 = *(long *)&(local_50->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                        super__Vector_impl_data;
      *(double *)(lVar9 + lVar13) = *(double *)(lVar9 + lVar13) + dVar14;
      lVar9 = *(long *)&pvVar2[uVar12].super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data;
      *(double *)(lVar9 + lVar13) = dVar14 * dVar14 + *(double *)(lVar9 + lVar13);
      dVar14 = *(double *)
                ((long)temp_Cmnk_ss_3.
                       super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start[uVar12].
                       super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_start + lVar13) +
               *(double *)
                ((long)temp_Cmnk_ss_4.
                       super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start[uVar12].
                       super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_start + lVar13);
      lVar9 = *(long *)&pvVar3[uVar12].super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data;
      *(double *)(lVar9 + lVar13) = *(double *)(lVar9 + lVar13) + dVar14;
      lVar9 = *(long *)&pvVar4[uVar12].super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data;
      *(double *)(lVar9 + lVar13) = dVar14 * dVar14 + *(double *)(lVar9 + lVar13);
      dVar14 = *(double *)
                ((long)temp_Cmnk_os_1.
                       super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start[uVar12].
                       super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_start + lVar13) +
               *(double *)
                ((long)temp_Cmnk_os_2.
                       super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start[uVar12].
                       super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_start + lVar13);
      lVar9 = *(long *)&pvVar5[uVar12].super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data;
      *(double *)(lVar9 + lVar13) = *(double *)(lVar9 + lVar13) + dVar14;
      lVar9 = *(long *)&pvVar6[uVar12].super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data;
      *(double *)(lVar9 + lVar13) = dVar14 * dVar14 + *(double *)(lVar9 + lVar13);
      dVar14 = *(double *)
                ((long)temp_Cmnk_os_3.
                       super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start[uVar12].
                       super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_start + lVar13) +
               *(double *)
                ((long)temp_Cmnk_os_4.
                       super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start[uVar12].
                       super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_start + lVar13);
      lVar9 = *(long *)&pvVar7[uVar12].super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data;
      *(double *)(lVar9 + lVar13) = *(double *)(lVar9 + lVar13) + dVar14;
      lVar9 = *(long *)&pvVar8[uVar12].super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data;
      *(double *)(lVar9 + lVar13) = dVar14 * dVar14 + *(double *)(lVar9 + lVar13);
    }
    local_58 = uVar12;
    uVar11 = uVar12 + 1;
  }
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::~vector(&temp_Cmnk_err);
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::~vector(&temp_Cmnk_os_4);
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::~vector(&temp_Cmnk_os_3);
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::~vector(&temp_Cmnk_os_2);
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::~vector(&temp_Cmnk_os_1);
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::~vector(&temp_Cmnk_ss_4);
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::~vector(&temp_Cmnk_ss_3);
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::~vector(&temp_Cmnk_ss_2);
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::~vector(&temp_Cmnk_ss_1);
  return;
}

Assistant:

void singleParticleSpectra::calculate_three_particle_correlation_deltaeta_chdep(
    vector<vector<double>> &event_Qn_p_rap_real,
    vector<vector<double>> &event_Qn_p_rap_imag,
    vector<vector<double>> &event_Qn_m_rap_real,
    vector<vector<double>> &event_Qn_m_rap_imag,
    vector<vector<double>> &event_Qn_rap_real,
    vector<vector<double>> &event_Qn_rap_imag,
    vector<vector<double>> &Cmnk_ss_eta12,
    vector<vector<double>> &Cmnk_ss_eta12_err,
    vector<vector<double>> &Cmnk_os_eta12,
    vector<vector<double>> &Cmnk_os_eta12_err,
    vector<vector<double>> &Cmnk_ss_eta13,
    vector<vector<double>> &Cmnk_ss_eta13_err,
    vector<vector<double>> &Cmnk_os_eta13,
    vector<vector<double>> &Cmnk_os_eta13_err) {
    vector<vector<double>> temp_Cmnk_ss_1(num_corr, vector<double>(N_rap, 0.));
    vector<vector<double>> temp_Cmnk_ss_2(num_corr, vector<double>(N_rap, 0.));
    vector<vector<double>> temp_Cmnk_ss_3(num_corr, vector<double>(N_rap, 0.));
    vector<vector<double>> temp_Cmnk_ss_4(num_corr, vector<double>(N_rap, 0.));
    vector<vector<double>> temp_Cmnk_os_1(num_corr, vector<double>(N_rap, 0.));
    vector<vector<double>> temp_Cmnk_os_2(num_corr, vector<double>(N_rap, 0.));
    vector<vector<double>> temp_Cmnk_os_3(num_corr, vector<double>(N_rap, 0.));
    vector<vector<double>> temp_Cmnk_os_4(num_corr, vector<double>(N_rap, 0.));
    vector<vector<double>> temp_Cmnk_err(num_corr, vector<double>(N_rap, 0.));

    calculate_three_particle_correlation_deltaeta(
        event_Qn_p_rap_real, event_Qn_p_rap_imag, event_Qn_m_rap_real,
        event_Qn_m_rap_imag, event_Qn_rap_real, event_Qn_rap_imag, 1, 2,
        temp_Cmnk_os_1, temp_Cmnk_err);
    calculate_three_particle_correlation_deltaeta(
        event_Qn_m_rap_real, event_Qn_m_rap_imag, event_Qn_p_rap_real,
        event_Qn_p_rap_imag, event_Qn_rap_real, event_Qn_rap_imag, 1, 2,
        temp_Cmnk_os_2, temp_Cmnk_err);
    calculate_three_particle_correlation_deltaeta(
        event_Qn_p_rap_real, event_Qn_p_rap_imag, event_Qn_m_rap_real,
        event_Qn_m_rap_imag, event_Qn_rap_real, event_Qn_rap_imag, 2, 2,
        temp_Cmnk_os_3, temp_Cmnk_err);
    calculate_three_particle_correlation_deltaeta(
        event_Qn_m_rap_real, event_Qn_m_rap_imag, event_Qn_p_rap_real,
        event_Qn_p_rap_imag, event_Qn_rap_real, event_Qn_rap_imag, 2, 2,
        temp_Cmnk_os_4, temp_Cmnk_err);
    calculate_three_particle_correlation_deltaeta(
        event_Qn_p_rap_real, event_Qn_p_rap_imag, event_Qn_p_rap_real,
        event_Qn_p_rap_imag, event_Qn_rap_real, event_Qn_rap_imag, 1, 1,
        temp_Cmnk_ss_1, temp_Cmnk_err);
    calculate_three_particle_correlation_deltaeta(
        event_Qn_m_rap_real, event_Qn_m_rap_imag, event_Qn_m_rap_real,
        event_Qn_m_rap_imag, event_Qn_rap_real, event_Qn_rap_imag, 1, 1,
        temp_Cmnk_ss_2, temp_Cmnk_err);
    calculate_three_particle_correlation_deltaeta(
        event_Qn_p_rap_real, event_Qn_p_rap_imag, event_Qn_p_rap_real,
        event_Qn_p_rap_imag, event_Qn_rap_real, event_Qn_rap_imag, 2, 1,
        temp_Cmnk_ss_3, temp_Cmnk_err);
    calculate_three_particle_correlation_deltaeta(
        event_Qn_m_rap_real, event_Qn_m_rap_imag, event_Qn_m_rap_real,
        event_Qn_m_rap_imag, event_Qn_rap_real, event_Qn_rap_imag, 2, 1,
        temp_Cmnk_ss_4, temp_Cmnk_err);

    for (int i = 0; i < num_corr; i++) {
        for (int j = 0; j < N_rap; j++) {
            double temp_ss_12 = temp_Cmnk_ss_1[i][j] + temp_Cmnk_ss_2[i][j];
            Cmnk_ss_eta12[i][j] += temp_ss_12;
            Cmnk_ss_eta12_err[i][j] += temp_ss_12 * temp_ss_12;
            double temp_ss_13 = temp_Cmnk_ss_3[i][j] + temp_Cmnk_ss_4[i][j];
            Cmnk_ss_eta13[i][j] += temp_ss_13;
            Cmnk_ss_eta13_err[i][j] += temp_ss_13 * temp_ss_13;
            double temp_os_12 = temp_Cmnk_os_1[i][j] + temp_Cmnk_os_2[i][j];
            Cmnk_os_eta12[i][j] += temp_os_12;
            Cmnk_os_eta12_err[i][j] += temp_os_12 * temp_os_12;
            double temp_os_13 = temp_Cmnk_os_3[i][j] + temp_Cmnk_os_4[i][j];
            Cmnk_os_eta13[i][j] += temp_os_13;
            Cmnk_os_eta13_err[i][j] += temp_os_13 * temp_os_13;
        }
    }
}